

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::update_peer_dscp(session_impl *this)

{
  ushort uVar1;
  pointer psVar2;
  basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *s;
  element_type *s_00;
  _Alloc_hider _Var3;
  uint v;
  element_type *peVar4;
  pointer psVar5;
  address local_e8;
  error_code ec;
  data_union local_b4;
  error_code ec_1;
  string local_70;
  undefined8 local_50 [4];
  
  v = session_settings::get_int(&this->m_settings,0x4028);
  psVar2 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar5 = (this->m_listen_sockets).
                super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar2; psVar5 = psVar5 + 1) {
    peVar4 = (psVar5->
             super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    s = (peVar4->sock).
        super___shared_ptr<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr;
    if (s != (basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)0x0) {
      ec.val_ = 0;
      ec.failed_ = false;
      ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                 super_error_category;
      set_traffic_class<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                (s,v,&ec);
      if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
        boost::asio::
        basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        ::local_endpoint((endpoint_type *)&local_b4.base,
                         (((psVar5->
                           super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->sock).
                         super___shared_ptr<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
        if (local_b4.base.sa_family != 2) {
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = local_b4.base.sa_data[6];
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = local_b4.base.sa_data[7];
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = local_b4.base.sa_data[8];
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = local_b4.base.sa_data[9];
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = local_b4.base.sa_data[10];
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = local_b4.base.sa_data[0xb];
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = local_b4.base.sa_data[0xc];
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = local_b4.base.sa_data[0xd];
          local_e8.ipv6_address_.addr_.__in6_u._8_8_ = local_b4._16_8_;
          local_e8.ipv6_address_.scope_id_ = (unsigned_long)local_b4.v6.sin6_scope_id;
          local_e8.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
        }
        else {
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
          local_e8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
          local_e8.ipv6_address_.scope_id_ = 0;
          local_e8.ipv4_address_.addr_.s_addr = local_b4.v4.sin_addr.s_addr;
        }
        local_e8.type_ = (anon_enum_32)(local_b4.base.sa_family != 2);
        boost::asio::ip::address::to_string_abi_cxx11_(&local_70,&local_e8);
        _Var3._M_p = local_70._M_dataplus._M_p;
        boost::asio::
        basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        ::local_endpoint((endpoint_type *)&ec_1,
                         (((psVar5->
                           super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->sock).
                         super___shared_ptr<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
        uVar1 = ec_1.val_._2_2_;
        (*(ec.cat_)->_vptr_error_category[4])((string *)local_50,ec.cat_,(ulong)(uint)ec.val_);
        session_log(this,">>> SET_DSCP [ tcp (%s %d) value: %x e: %s ]",_Var3._M_p,
                    (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8),(ulong)v,local_50[0]);
        ::std::__cxx11::string::~string((string *)local_50);
        ::std::__cxx11::string::~string((string *)&local_70);
      }
      peVar4 = (psVar5->
               super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
    }
    s_00 = (peVar4->udp_sock).
           super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    if (s_00 != (element_type *)0x0) {
      ec_1.val_ = 0;
      ec_1.failed_ = false;
      ec_1.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                   super_error_category;
      set_traffic_class<libtorrent::aux::udp_socket>(&s_00->sock,v,&ec_1);
      if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
        udp_socket::local_endpoint
                  ((endpoint *)&local_b4.base,
                   &((((psVar5->
                       super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->udp_sock).
                     super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->sock);
        if (local_b4.base.sa_family != 2) {
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = local_b4.base.sa_data[6];
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = local_b4.base.sa_data[7];
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = local_b4.base.sa_data[8];
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = local_b4.base.sa_data[9];
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = local_b4.base.sa_data[10];
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = local_b4.base.sa_data[0xb];
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = local_b4.base.sa_data[0xc];
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = local_b4.base.sa_data[0xd];
          local_e8.ipv6_address_.addr_.__in6_u._8_8_ = local_b4._16_8_;
          local_e8.ipv6_address_.scope_id_ = (unsigned_long)local_b4.v6.sin6_scope_id;
          local_e8.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
        }
        else {
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
          local_e8.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
          local_e8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
          local_e8.ipv6_address_.scope_id_ = 0;
          local_e8.ipv4_address_.addr_.s_addr = local_b4.v4.sin_addr.s_addr;
        }
        local_e8.type_ = (anon_enum_32)(local_b4.base.sa_family != 2);
        boost::asio::ip::address::to_string_abi_cxx11_(&local_70,&local_e8);
        _Var3._M_p = local_70._M_dataplus._M_p;
        uVar1 = (((((psVar5->
                    super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->udp_sock).
                  super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->sock).m_bind_port;
        (*(ec_1.cat_)->_vptr_error_category[4])((string *)local_50,ec_1.cat_,(ulong)(uint)ec_1.val_)
        ;
        session_log(this,">>> SET_DSCP [ udp (%s %d) value: %x e: %s ]",_Var3._M_p,(ulong)uVar1,
                    (ulong)v,local_50[0]);
        ::std::__cxx11::string::~string((string *)local_50);
        ::std::__cxx11::string::~string((string *)&local_70);
      }
    }
  }
  return;
}

Assistant:

void session_impl::update_peer_dscp()
	{
		int const value = m_settings.get_int(settings_pack::peer_dscp);
		for (auto const& l : m_listen_sockets)
		{
			if (l->sock)
			{
				error_code ec;
				set_traffic_class(*l->sock, value, ec);

#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					session_log(">>> SET_DSCP [ tcp (%s %d) value: %x e: %s ]"
						, l->sock->local_endpoint().address().to_string().c_str()
						, l->sock->local_endpoint().port(), value, ec.message().c_str());
				}
#endif
			}

			if (l->udp_sock)
			{
				error_code ec;
				set_traffic_class(l->udp_sock->sock, value, ec);

#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					session_log(">>> SET_DSCP [ udp (%s %d) value: %x e: %s ]"
						, l->udp_sock->sock.local_endpoint().address().to_string().c_str()
						, l->udp_sock->sock.local_port()
						, value, ec.message().c_str());
				}
#endif
			}
		}
	}